

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O1

int Pdr_ManSimDataInit(Aig_Man_t *pAig,Vec_Int_t *vCiObjs,Vec_Int_t *vCiVals,Vec_Int_t *vNodes,
                      Vec_Int_t *vCoObjs,Vec_Int_t *vCoVals,Vec_Int_t *vCi2Rem)

{
  uint *puVar1;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  byte bVar4;
  uint uVar5;
  void *pvVar6;
  Aig_Obj_t *pAVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  
  puVar1 = pAig->pTerSimData;
  iVar11 = pAig->pConst1->Id;
  iVar8 = iVar11 >> 4;
  bVar4 = (char)iVar11 * '\x02';
  puVar1[iVar8] = (puVar1[iVar8] >> (bVar4 & 0x1f) & 3 ^ 2) << (bVar4 & 0x1f) ^ puVar1[iVar8];
  if (0 < vCiObjs->nSize) {
    piVar2 = vCiObjs->pArray;
    pVVar3 = pAig->vObjs;
    lVar10 = 0;
    do {
      if (pVVar3 == (Vec_Ptr_t *)0x0) {
        pvVar6 = (void *)0x0;
      }
      else {
        uVar5 = piVar2[lVar10];
        if (((int)uVar5 < 0) || (pVVar3->nSize <= (int)uVar5)) goto LAB_005f1d4a;
        pvVar6 = pVVar3->pArray[uVar5];
      }
      if (vCiVals->nSize <= lVar10) goto LAB_005f1d69;
      iVar11 = *(int *)((long)pvVar6 + 0x24) >> 4;
      bVar4 = (char)*(int *)((long)pvVar6 + 0x24) * '\x02';
      puVar1[iVar11] =
           (puVar1[iVar11] >> (bVar4 & 0x1f) & 3 ^ 2 - (vCiVals->pArray[lVar10] == 0)) <<
           (bVar4 & 0x1f) ^ puVar1[iVar11];
      lVar10 = lVar10 + 1;
    } while (lVar10 < vCiObjs->nSize);
  }
  if ((vCi2Rem != (Vec_Int_t *)0x0) && (0 < vCi2Rem->nSize)) {
    piVar2 = vCi2Rem->pArray;
    pVVar3 = pAig->vObjs;
    lVar10 = 0;
    do {
      iVar11 = piVar2[lVar10];
      if (((long)iVar11 < 0) || (pVVar3->nSize <= iVar11)) goto LAB_005f1d4a;
      iVar11 = *(int *)((long)pVVar3->pArray[iVar11] + 0x24);
      iVar8 = iVar11 >> 4;
      bVar4 = (char)iVar11 * '\x02';
      puVar1[iVar8] = (~(puVar1[iVar8] >> (bVar4 & 0x1f)) & 3) << (bVar4 & 0x1f) ^ puVar1[iVar8];
      lVar10 = lVar10 + 1;
    } while (lVar10 < vCi2Rem->nSize);
  }
  if (0 < vNodes->nSize) {
    lVar10 = 0;
    do {
      pVVar3 = pAig->vObjs;
      if (pVVar3 == (Vec_Ptr_t *)0x0) {
        pAVar7 = (Aig_Obj_t *)0x0;
      }
      else {
        uVar5 = vNodes->pArray[lVar10];
        if (((int)uVar5 < 0) || (pVVar3->nSize <= (int)uVar5)) goto LAB_005f1d4a;
        pAVar7 = (Aig_Obj_t *)pVVar3->pArray[uVar5];
      }
      Pdr_ManExtendOneEval(pAig,pAVar7);
      lVar10 = lVar10 + 1;
    } while (lVar10 < vNodes->nSize);
  }
  uVar5 = vCoObjs->nSize;
  if (0 < (int)uVar5) {
    lVar10 = 0;
    do {
      pVVar3 = pAig->vObjs;
      if (pVVar3 == (Vec_Ptr_t *)0x0) {
        pAVar7 = (Aig_Obj_t *)0x0;
      }
      else {
        uVar5 = vCoObjs->pArray[lVar10];
        if (((int)uVar5 < 0) || (pVVar3->nSize <= (int)uVar5)) goto LAB_005f1d4a;
        pAVar7 = (Aig_Obj_t *)pVVar3->pArray[uVar5];
      }
      Pdr_ManExtendOneEval(pAig,pAVar7);
      lVar10 = lVar10 + 1;
      uVar5 = vCoObjs->nSize;
    } while (lVar10 < (int)uVar5);
  }
  if (0 < (int)uVar5) {
    uVar9 = 0;
    do {
      iVar11 = vCoObjs->pArray[uVar9];
      if (((long)iVar11 < 0) || (pAig->vObjs->nSize <= iVar11)) {
LAB_005f1d4a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if ((long)vCoVals->nSize <= (long)uVar9) {
LAB_005f1d69:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar11 = *(int *)((long)pAig->vObjs->pArray[iVar11] + 0x24);
      if ((pAig->pTerSimData[iVar11 >> 4] >> ((char)iVar11 * '\x02' & 0x1fU) & 3) !=
          2 - (vCoVals->pArray[uVar9] == 0)) {
        return 0;
      }
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  return 1;
}

Assistant:

int Pdr_ManSimDataInit( Aig_Man_t * pAig,
    Vec_Int_t * vCiObjs, Vec_Int_t * vCiVals, Vec_Int_t * vNodes,
    Vec_Int_t * vCoObjs, Vec_Int_t * vCoVals, Vec_Int_t * vCi2Rem )
{
    Aig_Obj_t * pObj;
    int i;
    // set the CI values
    Pdr_ManSimInfoSet( pAig, Aig_ManConst1(pAig), PDR_ONE );
    Aig_ManForEachObjVec( vCiObjs, pAig, pObj, i )
        Pdr_ManSimInfoSet( pAig, pObj, (Vec_IntEntry(vCiVals, i)?PDR_ONE:PDR_ZER) );
    // set the FOs to remove
    if ( vCi2Rem != NULL )
    Aig_ManForEachObjVec( vCi2Rem, pAig, pObj, i )
        Pdr_ManSimInfoSet( pAig, pObj, PDR_UND );
    // perform ternary simulation
    Aig_ManForEachObjVec( vNodes, pAig, pObj, i )
        Pdr_ManExtendOneEval( pAig, pObj );
    // transfer results to the output
    Aig_ManForEachObjVec( vCoObjs, pAig, pObj, i )
        Pdr_ManExtendOneEval( pAig, pObj );
    // check the results
    Aig_ManForEachObjVec( vCoObjs, pAig, pObj, i )
        if ( Pdr_ManSimInfoGet( pAig, pObj ) != (Vec_IntEntry(vCoVals, i)?PDR_ONE:PDR_ZER) )
            return 0;
    return 1;
}